

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

void __thiscall FParser::NextToken(FParser *this)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  tokentype_t tVar4;
  size_t sVar5;
  ulong uVar6;
  DFsSection *pDVar7;
  int iVar8;
  ulong in_RCX;
  uint uVar9;
  byte *pbVar10;
  byte *brace;
  char *pcVar11;
  
  iVar8 = this->NumTokens;
  pcVar11 = this->Tokens[(long)iVar8 + -1];
  if ((*pcVar11 != '\0') || (this->TokenType[(long)iVar8 + -1] == string_)) {
    this->NumTokens = iVar8 + 1;
    sVar5 = strlen(pcVar11);
    this->Tokens[iVar8] = pcVar11 + sVar5 + 1;
    pcVar11[sVar5 + 1] = '\0';
  }
  brace = (byte *)this->Rover;
  bVar1 = *brace;
  uVar6 = (ulong)bVar1;
  pbVar10 = brace;
  if (bVar1 == 0) {
LAB_004f8e9f:
    brace = pbVar10;
    if (*this->Tokens[0] == '\0') {
      return;
    }
    pcVar11 = "missing \';\'\n";
  }
  else {
    if ((bVar1 == 0x20) || ((char)bVar1 < ' ')) {
      while( true ) {
        pbVar10 = brace + 1;
        cVar2 = (char)uVar6;
        if ((' ' < cVar2) || (cVar2 == '\0')) break;
        this->Rover = (char *)pbVar10;
        uVar6 = (ulong)*pbVar10;
        brace = pbVar10;
      }
      if (cVar2 == '\0') goto LAB_004f8e9f;
    }
    in_RCX = (ulong)this->NumTokens;
    if ((char)uVar6 == '(' && 1 < (long)in_RCX) {
      uVar9 = this->NumTokens - 2;
      cVar2 = '(';
      if (this->TokenType[uVar9] != name_) goto LAB_004f8eb5;
      this->TokenType[uVar9] = function;
      uVar6 = (ulong)*brace;
    }
    cVar2 = (char)uVar6;
    if (cVar2 == '\"') goto LAB_004f8f34;
    iVar8 = (int)uVar6;
    if (iVar8 == 0x3a) {
      this->NumTokens = 1;
      *this->Tokens[0] = '\0';
      this->TokenType[(long)this->NumTokens + -1] = name_;
      this->Rover = this->Rover + 1;
      return;
    }
    if (iVar8 == 0x7d) {
      this->BraceType = 1;
      pDVar7 = DFsScript::FindSectionEnd(this->Script,(char *)brace);
    }
    else {
      if (iVar8 != 0x7b) {
LAB_004f8eb5:
        bVar3 = isop((int)cVar2);
        if (bVar3) {
          tVar4 = operator_;
        }
        else if ((byte)(*this->Rover - 0x30U) < 10) {
          tVar4 = number;
        }
        else {
          tVar4 = (tokentype_t)(*this->Rover == '.');
        }
        this->TokenType[(long)this->NumTokens + -1] = tVar4;
        return;
      }
      this->BraceType = 0;
      pDVar7 = DFsScript::FindSectionStart(this->Script,(char *)brace);
    }
    this->Section = pDVar7;
    if (pDVar7 != (DFsSection *)0x0) {
      return;
    }
    pcVar11 = "section not found!\n";
    in_RCX = uVar6;
  }
  script_error(pcVar11);
LAB_004f8f34:
  this->TokenType[in_RCX - 1] = string_;
  if (this->TokenType[in_RCX - 2] == string_) {
    this->NumTokens = (int)in_RCX + -1;
  }
  this->Rover = (char *)(brace + 1);
  return;
}

Assistant:

void FParser::NextToken()
{
	if(Tokens[NumTokens-1][0] || TokenType[NumTokens-1]==string_)
    {
		NumTokens++;
		Tokens[NumTokens-1] = Tokens[NumTokens-2] + strlen(Tokens[NumTokens-2]) + 1;
		Tokens[NumTokens-1][0] = 0;
    }
	
	// get to the next token, ignoring spaces, newlines,
	// useless chars, comments etc
	
	while(1)
    {
		// empty whitespace
		if(*Rover && (*Rover==' ' || *Rover<32))
		{
			while((*Rover==' ' || *Rover<32) && *Rover) Rover++;
		}
		// end-of-script?
		if(!*Rover)
		{
			if(Tokens[0][0])
			{
				// line contains text, but no semicolon: an error
				script_error("missing ';'\n");
			}
			// empty line, end of command-list
			return;
		}
		break;  // otherwise
    }
	
	if(NumTokens>1 && *Rover == '(' && TokenType[NumTokens-2] == name_)
		TokenType[NumTokens-2] = function;
	
	if(*Rover == '{' || *Rover == '}')
    {
		if(*Rover == '{')
		{
			BraceType = bracket_open;
			Section = Script->FindSectionStart(Rover);
		}
		else            // closing brace
		{
			BraceType = bracket_close;
			Section = Script->FindSectionEnd(Rover);
		}
		if(!Section)
		{
			script_error("section not found!\n");
			return;
		}
    }
	else if(*Rover == ':')  // label
    {
		// ignore the label : reset
		NumTokens = 1;
		Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
		Rover++;        // ignore
    }
	else if(*Rover == '\"')
    {
		TokenType[NumTokens-1] = string_;
		if(TokenType[NumTokens-2] == string_) NumTokens--;   // join strings
		Rover++;
    }
	else
    {
		TokenType[NumTokens-1] = isop(*Rover) ? operator_ : isnum(*Rover) ? number : name_;
    }
}